

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

NewOrderSingle * __thiscall
Application::queryNewOrderSingle42(NewOrderSingle *__return_storage_ptr__,Application *this)

{
  char cVar1;
  Application *pAVar2;
  OrdType ordType;
  Application local_281;
  FieldBase local_228;
  FieldBase local_1d0;
  FieldBase local_178;
  FieldBase local_120;
  FieldBase local_c8;
  FieldBase local_70;
  
  pAVar2 = this;
  FIX::OrdType::OrdType((OrdType *)&local_228);
  queryClOrdID((ClOrdID *)((long)&local_281.super_Application._vptr_Application + 1),pAVar2);
  pAVar2 = &local_281;
  local_281.super_Application._vptr_Application._0_1_ = 0x31;
  FIX::HandlInst::HandlInst((HandlInst *)&local_70,(CHAR *)pAVar2);
  querySymbol((Symbol *)&local_c8,pAVar2);
  querySide((Side *)&local_120,pAVar2);
  FIX::TransactTime::TransactTime((TransactTime *)&local_178);
  queryOrdType((OrdType *)&local_1d0,pAVar2);
  FIX::FieldBase::operator=(&local_228,&local_1d0);
  pAVar2 = (Application *)((long)&local_281.super_Application._vptr_Application + 1);
  FIX42::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,(ClOrdID *)pAVar2,(HandlInst *)&local_70,(Symbol *)&local_c8,
             (Side *)&local_120,(TransactTime *)&local_178,(OrdType *)&local_228);
  FIX::FieldBase::~FieldBase(&local_1d0);
  FIX::FieldBase::~FieldBase(&local_178);
  FIX::FieldBase::~FieldBase(&local_120);
  FIX::FieldBase::~FieldBase(&local_c8);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_281.super_Application._vptr_Application + 1));
  queryOrderQty((OrderQty *)((long)&local_281.super_Application._vptr_Application + 1),pAVar2);
  pAVar2 = (Application *)((long)&local_281.super_Application._vptr_Application + 1);
  FIX42::NewOrderSingle::set(__return_storage_ptr__,(OrderQty *)pAVar2);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_281.super_Application._vptr_Application + 1));
  queryTimeInForce((TimeInForce *)((long)&local_281.super_Application._vptr_Application + 1),pAVar2)
  ;
  pAVar2 = (Application *)((long)&local_281.super_Application._vptr_Application + 1);
  FIX42::NewOrderSingle::set(__return_storage_ptr__,(TimeInForce *)pAVar2);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_281.super_Application._vptr_Application + 1));
  cVar1 = FIX::CharField::getValue((CharField *)&local_228);
  if (cVar1 == '2') {
LAB_0011b812:
    queryPrice((Price *)((long)&local_281.super_Application._vptr_Application + 1),pAVar2);
    pAVar2 = (Application *)((long)&local_281.super_Application._vptr_Application + 1);
    FIX42::NewOrderSingle::set(__return_storage_ptr__,(Price *)pAVar2);
    FIX::FieldBase::~FieldBase
              ((FieldBase *)((long)&local_281.super_Application._vptr_Application + 1));
  }
  else {
    cVar1 = FIX::CharField::getValue((CharField *)&local_228);
    if (cVar1 == '4') goto LAB_0011b812;
  }
  cVar1 = FIX::CharField::getValue((CharField *)&local_228);
  if (cVar1 != '3') {
    cVar1 = FIX::CharField::getValue((CharField *)&local_228);
    if (cVar1 != '4') goto LAB_0011b870;
  }
  queryStopPx((StopPx *)((long)&local_281.super_Application._vptr_Application + 1),pAVar2);
  FIX42::NewOrderSingle::set
            (__return_storage_ptr__,
             (StopPx *)((long)&local_281.super_Application._vptr_Application + 1));
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_281.super_Application._vptr_Application + 1));
LAB_0011b870:
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  FIX::FieldBase::~FieldBase(&local_228);
  return __return_storage_ptr__;
}

Assistant:

FIX42::NewOrderSingle Application::queryNewOrderSingle42() {
  FIX::OrdType ordType;

  FIX42::NewOrderSingle newOrderSingle(
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      FIX::TransactTime(),
      ordType = queryOrdType());

  newOrderSingle.set(queryOrderQty());
  newOrderSingle.set(queryTimeInForce());
  if (ordType == FIX::OrdType_LIMIT || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryPrice());
  }
  if (ordType == FIX::OrdType_STOP || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryStopPx());
  }

  queryHeader(newOrderSingle.getHeader());
  return newOrderSingle;
}